

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

void __thiscall vkt::SpirVAssembly::ConvertCase::~ConvertCase(ConvertCase *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  pSVar2 = (this->m_outputBuffer).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_outputBuffer).m_ptr = (BufferInterface *)0x0;
      (*((this->m_outputBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_outputBuffer).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_outputBuffer).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_outputBuffer).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar2 = (this->m_inputBuffer).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_inputBuffer).m_ptr = (BufferInterface *)0x0;
      (*((this->m_inputBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_inputBuffer).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_inputBuffer).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_inputBuffer).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->m_asmTypes)._M_t);
  pcVar3 = (this->m_name)._M_dataplus._M_p;
  paVar4 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ConvertCase (IntegerType from, IntegerType to, deInt64 number)
	: m_fromType		(from)
	, m_toType			(to)
	, m_features		(getConversionUsedFeatures(from, to))
	, m_name			(getTestName(from, to))
	, m_inputBuffer		(getBuffer(from, number))
	, m_outputBuffer	(getBuffer(to, number))
	{
		m_asmTypes["inputType"]		= getAsmTypeDeclaration(from);
		m_asmTypes["outputType"]	= getAsmTypeDeclaration(to);

		if (m_features == COMPUTE_TEST_USES_INT16)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int16\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT64)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int64\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT16_INT64)
		{
			m_asmTypes["int_capabilities"] = string("OpCapability Int16\n") +
													"OpCapability Int64\n";
		}
		else
		{
			DE_ASSERT(false);
		}
	}